

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O0

uint16_t NJamSpell::PackInt32(uint32_t num)

{
  double dVar1;
  double r;
  uint32_t num_local;
  
  dVar1 = (double)num / 268435456.0;
  if (dVar1 < 0.0 || 1.0 < dVar1) {
    __assert_fail("r >= 0.0 && r <= 1.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/jamspell/lang_model.cpp"
                  ,0x45,"uint16_t NJamSpell::PackInt32(uint32_t)");
  }
  dVar1 = pow(dVar1,0.2);
  return (uint16_t)(int)(dVar1 * 65536.0);
}

Assistant:

uint16_t PackInt32(uint32_t num) {
    double r = double(num) / double(MAX_REAL_NUM);
    assert(r >= 0.0 && r <= 1.0);
    r = pow(r, 0.2);
    r *= MAX_AVAILABLE_NUM;
    return uint16_t(r);
}